

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O2

uint8_t decBiStr(char *targ,char *str1,char *str2)

{
  char cVar1;
  long lVar2;
  
  for (lVar2 = 0; (cVar1 = targ[lVar2], cVar1 == str1[lVar2] || (cVar1 == str2[lVar2]));
      lVar2 = lVar2 + 1) {
    if (cVar1 == '\0') {
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

static Flag decBiStr(const char *targ, const char *str1, const char *str2) {
  for (;;targ++, str1++, str2++) {
    if (*targ!=*str1 && *targ!=*str2) return 0;
    /* *targ has a match in one (or both, if terminator)  */
    if (*targ=='\0') break;
    } /* forever  */
  return 1;
  }